

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O3

Vector<double,_2,_true> __thiscall
Nova::Vector<double,_2,_true>::operator-(Vector<double,_2,_true> *this,double a)

{
  double dVar1;
  Vector<double,_2,_true> *in_RSI;
  Vector<double,_2,_true> VVar2;
  
  Vector(this,in_RSI);
  dVar1 = (this->_data)._M_elems[1];
  VVar2._data._M_elems[0] = (this->_data)._M_elems[0] - a;
  (this->_data)._M_elems[0] = VVar2._data._M_elems[0];
  (this->_data)._M_elems[1] = dVar1 - a;
  VVar2._data._M_elems[1] = a;
  return (Vector<double,_2,_true>)VVar2._data._M_elems;
}

Assistant:

Vector operator-(T a) const
    {
        Vector data_copy(*this);
        data_copy-=a;
        return data_copy;
    }